

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsProtocol.cpp
# Opt level: O3

void __thiscall xs::MessageParser::getString(MessageParser *this,string *dst)

{
  deUint8 dVar1;
  ulong uVar2;
  Error *this_00;
  
  uVar2 = this->m_pos;
  do {
    dVar1 = this->m_data[uVar2];
    this->m_pos = uVar2 + 1;
    if (dVar1 == '\0') {
      return;
    }
    std::__cxx11::string::push_back((char)dst);
    uVar2 = this->m_pos;
  } while (uVar2 < this->m_size);
  this_00 = (Error *)__cxa_allocate_exception(0x10);
  Error::Error(this_00,"Unterminated string payload","m_pos < m_size",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/execserver/xsProtocol.cpp"
               ,0x49);
  __cxa_throw(this_00,&Error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void getString (std::string& dst)
	{
		// \todo [2011-09-30 pyry] We should really send a size parameter instead.
		while (m_data[m_pos] != 0)
		{
			dst += (char)m_data[m_pos++];
			XS_CHECK_MSG(m_pos < m_size, "Unterminated string payload");
		}

		m_pos += 1;
	}